

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O0

SamProgram * __thiscall
BamTools::SamProgramChain::operator[](SamProgramChain *this,string *programId)

{
  int iVar1;
  size_type sVar2;
  undefined8 uVar3;
  reference pvVar4;
  vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_> *in_RDI;
  int index;
  size_type in_stack_ffffffffffffff68;
  vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  RuleToken *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  allocator local_39;
  string local_38 [36];
  int local_14;
  
  iVar1 = IndexOf((SamProgramChain *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_14 = iVar1;
  sVar2 = std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>::size(in_RDI);
  if (iVar1 == (int)sVar2) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"SamProgramChain::operator[]",&local_39);
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    Internal::BamException::BamException
              ((BamException *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
    __cxa_throw(uVar3,&Internal::BamException::typeinfo,Internal::BamException::~BamException);
  }
  pvVar4 = std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>::at
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return pvVar4;
}

Assistant:

SamProgram& SamProgramChain::operator[](const std::string& programId)
{

    // look up program record matching this ID
    int index = IndexOf(programId);

    // if record not found
    if (index == (int)m_data.size()) {
        throw Internal::BamException("SamProgramChain::operator[]",
                                     "unknown programId: " + programId);
    }

    // otherwise return program record at index
    return m_data.at(index);
}